

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

Expr cons(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
         int argc)

{
  Expr EVar1;
  Expr EVar2;
  Expr expr;
  Expr car_00;
  Expr cdr_00;
  Expr cdr;
  Expr car;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr pair;
  
  if (argc != 2) {
    printf("cons: expected two arguments\n");
    exit(1);
  }
  EVar2._4_4_ = 0;
  EVar2.type = args->type;
  EVar2.field_1.val_atom = (args->field_1).val_atom;
  EVar1 = exec_eval(exec,callContext,EVar2);
  car_00.field_1 = EVar1.field_1;
  expr._4_4_ = 0;
  expr.type = args[1].type;
  expr.field_1.val_atom = args[1].field_1.val_atom;
  EVar2 = exec_eval(exec,callContext,expr);
  car_00._4_4_ = 0;
  car_00.type = EVar1.type;
  cdr_00._4_4_ = 0;
  cdr_00.type = EVar2.type;
  cdr_00.field_1.val_atom = EVar2.field_1.val_atom;
  EVar1 = make_pair(exec,car_00,cdr_00);
  if (EVar1.type == VT_NONE) {
    printf("cons: make_pair failed\n");
    exit(1);
  }
  EVar1._4_4_ = 0;
  return EVar1;
}

Assistant:

BUILTIN_FUNC(cons)
{
    if (argc != 2)
    {
        log("cons: expected two arguments");
        exit(1);
    }
    Expr car = exec_eval(exec, callContext, args[0]);
    Expr cdr = exec_eval(exec, callContext, args[1]);
    Expr pair = make_pair(exec, car, cdr);
    if (pair.type == VT_NONE)
    {
        log("cons: make_pair failed");
        exit(1);
    }
    return pair;
}